

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_stat(char *args)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  char local_88 [8];
  char timestring [65];
  PHYSFS_Stat stat;
  char *args_local;
  
  stat._32_8_ = args;
  if (*args == '\"') {
    stat._32_8_ = args + 1;
    sVar2 = strlen((char *)stat._32_8_);
    *(char *)(stat._32_8_ + (sVar2 - 1)) = '\0';
  }
  iVar1 = PHYSFS_stat(stat._32_8_,timestring + 0x40);
  if (iVar1 == 0) {
    uVar3 = PHYSFS_getLastError();
    printf("failed to stat. Reason [%s].\n",uVar3);
  }
  else {
    printf("Filename: %s\n",stat._32_8_);
    printf("Size %d\n",stack0xffffffffffffffc0 & 0xffffffff);
    if ((int)stat.accesstime == 0) {
      printf("Type: File\n");
    }
    else if ((int)stat.accesstime == 1) {
      printf("Type: Directory\n");
    }
    else if ((int)stat.accesstime == 2) {
      printf("Type: Symlink\n");
    }
    else {
      printf("Type: Unknown\n");
    }
    pcVar4 = modTimeToStr(stat.modtime,local_88,0x40);
    printf("Created at: %s",pcVar4);
    pcVar4 = modTimeToStr(stat.filesize,local_88,0x40);
    printf("Last modified at: %s",pcVar4);
    pcVar4 = modTimeToStr(stat.createtime,local_88,0x40);
    printf("Last accessed at: %s",pcVar4);
    pcVar4 = "false";
    if (stat.accesstime._4_4_ != 0) {
      pcVar4 = "true";
    }
    printf("Readonly: %s\n",pcVar4);
  }
  return 1;
}

Assistant:

static int cmd_stat(char *args)
{
    PHYSFS_Stat stat;
    char timestring[65];

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    if(!PHYSFS_stat(args, &stat))
    {
        printf("failed to stat. Reason [%s].\n", PHYSFS_getLastError());
        return 1;
    } /* if */

    printf("Filename: %s\n", args);
    printf("Size %d\n",(int) stat.filesize);

    if(stat.filetype == PHYSFS_FILETYPE_REGULAR)
        printf("Type: File\n");
    else if(stat.filetype == PHYSFS_FILETYPE_DIRECTORY)
        printf("Type: Directory\n");
    else if(stat.filetype == PHYSFS_FILETYPE_SYMLINK)
        printf("Type: Symlink\n");
    else
        printf("Type: Unknown\n");

    printf("Created at: %s", modTimeToStr(stat.createtime, timestring, 64));
    printf("Last modified at: %s", modTimeToStr(stat.modtime, timestring, 64));
    printf("Last accessed at: %s", modTimeToStr(stat.accesstime, timestring, 64));
    printf("Readonly: %s\n", stat.readonly ? "true" : "false");

    return 1;
}